

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pac_conn.cc
# Opt level: O0

void __thiscall ConnDecl::ProcessFlowElement(ConnDecl *this,AnalyzerFlow *flow_elem)

{
  Direction DVar1;
  undefined8 uVar2;
  char *pcVar3;
  AnalyzerFlow *in_RSI;
  string *in_RDI;
  int flow_index;
  Field *f;
  Type *in_stack_ffffffffffffff90;
  undefined4 in_stack_ffffffffffffffb8;
  undefined4 uVar4;
  undefined4 in_stack_ffffffffffffffbc;
  Exception *in_stack_ffffffffffffffc0;
  char local_38 [36];
  uint local_14;
  AnalyzerFlow *local_10;
  
  local_10 = in_RSI;
  DVar1 = AnalyzerFlow::dir(in_RSI);
  local_14 = (uint)(DVar1 != UP);
  if (*(long *)(&in_RDI[6]._M_dataplus + (long)(int)local_14 * 8) != 0) {
    uVar4 = CONCAT13(1,(int3)in_stack_ffffffffffffffb8);
    uVar2 = __cxa_allocate_exception(0x20);
    pcVar3 = "down";
    if (local_14 == 0) {
      pcVar3 = "up";
    }
    strfmt_abi_cxx11_(local_38,"%sflow already defined",pcVar3);
    Exception::Exception
              (in_stack_ffffffffffffffc0,(Object *)CONCAT44(in_stack_ffffffffffffffbc,uVar4),in_RDI)
    ;
    __cxa_throw(uVar2,&Exception::typeinfo,Exception::~Exception);
  }
  *(AnalyzerFlow **)(&in_RDI[6]._M_dataplus + (long)(int)local_14 * 8) = local_10;
  f = *(Field **)(in_RDI + 4);
  AnalyzerFlow::flow_field(local_10);
  Type::AddField(in_stack_ffffffffffffff90,f);
  return;
}

Assistant:

void ConnDecl::ProcessFlowElement(AnalyzerFlow* flow_elem)
	{
	int flow_index;

	if ( flow_elem->dir() == AnalyzerFlow::UP )
		flow_index = 0;
	else
		flow_index = 1;

	if ( flows_[flow_index] )
		{
		throw Exception(flow_elem,
		                strfmt("%sflow already defined", flow_index == 0 ? "up" : "down"));
		}

	flows_[flow_index] = flow_elem;
	type_->AddField(flow_elem->flow_field());
	}